

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cc
# Opt level: O3

void __thiscall phosg::Arguments::assert_none_unused(Arguments *this)

{
  pointer pAVar1;
  bool *pbVar2;
  _Hash_node_base *p_Var3;
  invalid_argument *piVar4;
  long lVar5;
  long lVar6;
  _Hash_node_base *p_Var7;
  string local_40;
  
  pAVar1 = (this->positional).
           super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->positional).
                super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  if (lVar5 != 0) {
    lVar5 = (lVar5 >> 3) * -0x3333333333333333;
    pbVar2 = &pAVar1->used;
    lVar6 = 0;
    do {
      if (*pbVar2 == false) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        string_printf_abi_cxx11_(&local_40,"(@%zu) excess argument",lVar6);
        ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_40);
        __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                    ::std::invalid_argument::~invalid_argument);
      }
      lVar6 = lVar6 + 1;
      pbVar2 = pbVar2 + 0x28;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  p_Var7 = (this->named)._M_h._M_before_begin._M_nxt;
  do {
    if (p_Var7 == (_Hash_node_base *)0x0) {
      return;
    }
    p_Var3 = p_Var7[5]._M_nxt;
    if (p_Var3 != p_Var7[6]._M_nxt) {
      lVar5 = 0;
      do {
        if (*(char *)&p_Var3[4]._M_nxt == '\0') {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          string_printf_abi_cxx11_(&local_40,"(--%s#%zu) excess argument",p_Var7[1]._M_nxt,lVar5);
          ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_40);
          __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                      ::std::invalid_argument::~invalid_argument);
        }
        lVar5 = lVar5 + 1;
        p_Var3 = p_Var3 + 5;
      } while (p_Var3 != p_Var7[6]._M_nxt);
    }
    p_Var7 = p_Var7->_M_nxt;
  } while( true );
}

Assistant:

void Arguments::assert_none_unused() const {
  for (size_t z = 0; z < this->positional.size(); z++) {
    const auto& arg = this->positional[z];
    if (!arg.used) {
      throw invalid_argument(string_printf("(@%zu) excess argument", z));
    }
  }
  for (const auto& named_it : this->named) {
    size_t index = 0;
    for (const auto& instance_it : named_it.second) {
      if (!instance_it.used) {
        throw invalid_argument(string_printf("(--%s#%zu) excess argument", named_it.first.c_str(), index));
      }
      index++;
    }
  }
}